

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Naming.hpp
# Opt level: O0

string * ArrVarName(string *brastr,Doublet *dket,string *prefix)

{
  long lVar1;
  string *in_RDI;
  string str;
  string tag;
  Gaussian *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  char (*in_stack_ffffffffffffff90) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char (*in_stack_ffffffffffffffa8) [6];
  allocator local_41;
  char (*in_stack_ffffffffffffffc0) [2];
  char *in_stack_ffffffffffffffc8;
  
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,"",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  }
  Gaussian::am(in_stack_ffffffffffffff30);
  Gaussian::am(in_stack_ffffffffffffff30);
  StringBuilder<char[6],std::__cxx11::string&,std::__cxx11::string_const&,char_const(&)[2],char_const&,char_const(&)[2],char_const&>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffc8);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    std::__cxx11::string::string(in_RDI,(string *)&stack0xffffffffffffff88);
  }
  else {
    StringBuilder<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return in_RDI;
}

Assistant:

inline std::string ArrVarName(const std::string & brastr, Doublet dket, const std::string & prefix = "")
{
    std::string tag = (dket.tag.size() ? dket.tag + "_" : "");
    std::string str = StringBuilder("INT__" , tag, brastr, "_", amchar[dket.left.am()],
                                    "_", amchar[dket.right.am()]);
    
    if(prefix.size())
        return StringBuilder(prefix, "_", str);
    else
        return str;
}